

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

nhdp_laddr * nhdp_db_link_addr_add(nhdp_link *lnk,netaddr *addr)

{
  nhdp_laddr *laddr;
  netaddr *addr_local;
  nhdp_link *lnk_local;
  
  lnk_local = (nhdp_link *)oonf_class_malloc(&_laddr_info);
  if (lnk_local == (nhdp_link *)0x0) {
    lnk_local = (nhdp_link *)0x0;
  }
  else {
    lnk_local->vtime_value = *(uint64_t *)addr->_addr;
    lnk_local->itime_value = *(uint64_t *)(addr->_addr + 8);
    *(undefined2 *)&(lnk_local->sym_time)._node.list.next = *(undefined2 *)&addr->_type;
    *(nhdp_link **)&(lnk_local->sym_time).jitter_pct = lnk_local;
    (lnk_local->heard_time)._node.left = (avl_node *)lnk_local;
    *(nhdp_link **)&(lnk_local->heard_time)._random = lnk_local;
    (lnk_local->sym_time)._node.list.prev = (list_entity *)lnk;
    avl_insert(&lnk->_addresses,&(lnk_local->sym_time)._node.left);
    avl_insert(&lnk->neigh->_link_addresses,&(lnk_local->sym_time)._random);
    avl_insert(&(lnk_local->sym_time)._node.list.prev[0x13].prev[0x1c].prev,
               &(lnk_local->heard_time)._node.key);
    oonf_class_event(&_laddr_info,lnk_local,1);
  }
  return (nhdp_laddr *)lnk_local;
}

Assistant:

struct nhdp_laddr *
nhdp_db_link_addr_add(struct nhdp_link *lnk, const struct netaddr *addr) {
  struct nhdp_laddr *laddr;

  laddr = oonf_class_malloc(&_laddr_info);
  if (laddr == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&laddr->link_addr, addr, sizeof(laddr->link_addr));
  laddr->_link_node.key = &laddr->link_addr;
  laddr->_neigh_node.key = &laddr->link_addr;
  laddr->_if_node.key = &laddr->link_addr;

  /* initialize back link */
  laddr->link = lnk;

  /* add to trees */
  avl_insert(&lnk->_addresses, &laddr->_link_node);
  avl_insert(&lnk->neigh->_link_addresses, &laddr->_neigh_node);
  nhdp_interface_add_laddr(laddr);

  /* trigger event */
  oonf_class_event(&_laddr_info, laddr, OONF_OBJECT_ADDED);

  return laddr;
}